

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofilebinconv.cpp
# Opt level: O2

void fmprofilebinconv::doit(void)

{
  size_t sVar1;
  OASIS_FLOAT OVar2;
  OASIS_FLOAT OVar3;
  int local_88;
  int local_84;
  ulong local_80;
  ulong uStack_78;
  ulong local_70;
  undefined8 uStack_68;
  fm_profile_old q;
  
  sVar1 = fread(&q,0x30,1,_stdin);
  do {
    if (sVar1 == 0) {
      return;
    }
    local_70 = 0;
    uStack_68 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_88 = q.policytc_id;
    local_84 = q.calcrule_id;
    OVar2 = q.limits;
    switch(q.calcrule_id) {
    case 1:
    case 3:
      OVar2 = q.deductible;
      OVar3 = q.limits;
      goto LAB_0010132d;
    case 2:
      local_80 = (ulong)(uint)q.deductible;
      local_70 = CONCAT44(q.share_prop_of_lim,q.limits);
      break;
    default:
      fprintf(_stderr,"Unknown calcrule_id %d\n");
      break;
    case 5:
      OVar2 = q.deductible_prop_of_loss;
      OVar3 = q.limit_prop_of_loss;
LAB_0010132d:
      local_80 = (ulong)(uint)OVar2;
      local_70 = (ulong)(uint)OVar3;
      break;
    case 9:
      local_80 = (ulong)(uint)q.deductible_prop_of_limit;
      goto LAB_00101377;
    case 10:
      uStack_78 = (ulong)(uint)q.deductible;
      break;
    case 0xb:
      local_80 = (ulong)(uint)q.deductible << 0x20;
      break;
    case 0xc:
      OVar2 = q.deductible;
      goto LAB_00101385;
    case 0xe:
      goto LAB_00101377;
    case 0xf:
      OVar2 = q.limit_prop_of_loss;
LAB_00101377:
      local_70 = (ulong)(uint)OVar2;
      break;
    case 0x10:
      OVar2 = q.deductible_prop_of_loss;
LAB_00101385:
      local_80 = (ulong)(uint)OVar2;
    }
    fwrite(&local_88,0x28,1,_stdout);
    sVar1 = fread(&q,0x30,1,_stdin);
  } while( true );
}

Assistant:

void doit() {

        fm_profile_old q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            fm_profile f;
            f.profile_id = q.policytc_id;
            f.calcrule_id = q.calcrule_id;
            switch (f.calcrule_id) {
            case 1:
            case 3: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
            } break;
            case 2: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
                f.share1 = q.share_prop_of_lim;
            } break;
            case 5: {
                f.deductible1 = q.deductible_prop_of_loss;
                f.limit = q.limit_prop_of_loss;
            } break;
            case 9: {
                f.deductible1 = q.deductible_prop_of_limit;
                f.limit = q.limits;
            } break;
            case 10: {
                f.deductible3 = q.deductible;
            } break;
            case 11: {
                f.deductible2 = q.deductible;
            } break;
            case 12: {
                f.deductible1 = q.deductible;
            } break;
            case 14: {
                f.limit = q.limits;
            } break;
            case 15: {
                f.limit = q.limit_prop_of_loss;
            } break;
            case 16: {
                f.deductible1 = q.deductible_prop_of_loss;
            } break;
            default:
                fprintf(stderr, "Unknown calcrule_id %d\n", q.calcrule_id);
            }

            f.attachment = 0;

            fwrite(&f, sizeof(f), 1, stdout);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }